

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.cpp
# Opt level: O0

void special_null_test(void)

{
  rtosc_arg_val_t a;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff4;
  undefined1 in_stack_fffffffffffffff6;
  undefined1 in_stack_fffffffffffffff7;
  
  rtosc_arg_val_null((rtosc_arg_val_t *)&stack0xffffffffffffffe8,'t');
  assert_int_eq(CONCAT13(in_stack_fffffffffffffff7,
                         CONCAT12(in_stack_fffffffffffffff6,in_stack_fffffffffffffff4)),
                in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0);
  rtosc_arg_val_null((rtosc_arg_val_t *)&stack0xffffffffffffffe8,'s');
  assert_null((void *)CONCAT17(in_stack_fffffffffffffff7,
                               CONCAT16(in_stack_fffffffffffffff6,
                                        CONCAT24(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0
                                                ))),in_stack_ffffffffffffffe8,0);
  rtosc_arg_val_null((rtosc_arg_val_t *)&stack0xffffffffffffffe8,'r');
  assert_int_eq(CONCAT13(in_stack_fffffffffffffff7,
                         CONCAT12(in_stack_fffffffffffffff6,in_stack_fffffffffffffff4)),
                in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0);
  rtosc_arg_val_null((rtosc_arg_val_t *)&stack0xffffffffffffffe8,'T');
  assert_int_eq(CONCAT13(in_stack_fffffffffffffff7,
                         CONCAT12(in_stack_fffffffffffffff6,in_stack_fffffffffffffff4)),
                in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0);
  assert_char_eq(in_stack_fffffffffffffff7,in_stack_fffffffffffffff6,in_stack_ffffffffffffffe8,0);
  rtosc_arg_val_null((rtosc_arg_val_t *)&stack0xffffffffffffffe8,'S');
  assert_null((void *)CONCAT17(in_stack_fffffffffffffff7,
                               CONCAT16(in_stack_fffffffffffffff6,
                                        CONCAT24(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0
                                                ))),in_stack_ffffffffffffffe8,0);
  rtosc_arg_val_null((rtosc_arg_val_t *)&stack0xffffffffffffffe8,'F');
  assert_int_eq(CONCAT13(in_stack_fffffffffffffff7,
                         CONCAT12(in_stack_fffffffffffffff6,in_stack_fffffffffffffff4)),
                in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0);
  assert_char_eq(in_stack_fffffffffffffff7,in_stack_fffffffffffffff6,in_stack_ffffffffffffffe8,0);
  return;
}

Assistant:

void special_null_test()
{
    rtosc_arg_val_t a;
    rtosc_arg_val_null(&a, 't');
    assert_int_eq(0, a.val.t, "(0)'t'", __LINE__);

    rtosc_arg_val_null(&a, 's');
    assert_null(a.val.s, "(0)'s'", __LINE__);

    rtosc_arg_val_null(&a, 'r');
    assert_int_eq(0, a.val.i, "(0)'r'", __LINE__);

    rtosc_arg_val_null(&a, 'T');
    assert_int_eq(a.val.T, 0, "(0)'T'", __LINE__);
    assert_char_eq(a.type, 'F', "(0)'T' (type)", __LINE__);

    rtosc_arg_val_null(&a, 'S');
    assert_null(a.val.s, "(0)'S'", __LINE__);

    rtosc_arg_val_null(&a, 'F');
    assert_int_eq(a.val.T, 0, "(0)'F'", __LINE__);
    assert_char_eq(a.type, 'F', "(0)'F' (type)", __LINE__);
}